

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O3

void cmSHA512_Update(SHA_CTX *context,sha_byte *data,size_t len)

{
  cm_sha2_uint64_t *pcVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  void *__dest;
  ulong uVar5;
  bool bVar6;
  
  if (len == 0) {
    return;
  }
  if ((context == (SHA_CTX *)0x0) || (data == (sha_byte *)0x0)) {
    __assert_fail("context != (SHA_CTX*)0 && data != (sha_byte*)0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cm_sha2.c"
                  ,0x579,"void cmSHA512_Update(SHA_CTX *, const sha_byte *, size_t)");
  }
  uVar3 = *(uint *)((context->s1).buffer + 0x20) >> 3 & 0x7f;
  if (uVar3 != 0) {
    uVar5 = (ulong)(0x80 - uVar3);
    __dest = (void *)((long)context + (ulong)uVar3 + 0x50);
    if (len < uVar5) {
      memcpy(__dest,data,len);
      pcVar1 = (context->s512).bitcount;
      bVar6 = CARRY8(*pcVar1,len * 8);
      *pcVar1 = *pcVar1 + len * 8;
      goto joined_r0x00134186;
    }
    memcpy(__dest,data,uVar5);
    uVar4 = (ulong)((0x80 - uVar3) * 8);
    pcVar1 = (context->s512).bitcount;
    uVar2 = *pcVar1;
    *pcVar1 = *pcVar1 + uVar4;
    if (CARRY8(uVar2,uVar4)) {
      (context->s512).bitcount[1] = (context->s512).bitcount[1] + 1;
    }
    data = data + uVar5;
    cmSHA512_Internal_Transform(context,(sha_word64 *)((context->s1).buffer + 0x30));
    len = len - uVar5;
  }
  for (; 0x7f < len; len = len - 0x80) {
    cmSHA512_Internal_Transform(context,(sha_word64 *)data);
    uVar5 = (context->s512).bitcount[0];
    (context->s512).bitcount[0] = uVar5 + 0x400;
    if (0xfffffffffffffbff < uVar5) {
      (context->s512).bitcount[1] = (context->s512).bitcount[1] + 1;
    }
    data = (sha_byte *)((long)data + 0x80);
  }
  if (len == 0) {
    return;
  }
  memcpy((context->s1).buffer + 0x30,data,len);
  pcVar1 = (context->s512).bitcount;
  bVar6 = CARRY8(*pcVar1,len * 8);
  *pcVar1 = *pcVar1 + len * 8;
joined_r0x00134186:
  if (bVar6) {
    (context->s512).bitcount[1] = (context->s512).bitcount[1] + 1;
  }
  return;
}

Assistant:

void SHA512_Update(SHA_CTX* context, const sha_byte *data, size_t len) {
	unsigned int	freespace, usedspace;

	if (len == 0) {
		/* Calling with no data is valid - we do nothing */
		return;
	}

	/* Sanity check: */
	assert(context != (SHA_CTX*)0 && data != (sha_byte*)0);

	usedspace = (unsigned int)((context->s512.bitcount[0] >> 3) % 128);
	if (usedspace > 0) {
		/* Calculate how much free space is available in the buffer */
		freespace = 128 - usedspace;

		if (len >= freespace) {
			/* Fill the buffer completely and process it */
			MEMCPY_BCOPY(&context->s512.buffer[usedspace], data, freespace);
			ADDINC128(context->s512.bitcount, freespace << 3);
			len -= freespace;
			data += freespace;
			SHA512_Internal_Transform(context, (const sha_word64*)context->s512.buffer);
		} else {
			/* The buffer is not yet full */
			MEMCPY_BCOPY(&context->s512.buffer[usedspace], data, len);
			ADDINC128(context->s512.bitcount, len << 3);
			/* Clean up: */
			usedspace = freespace = 0;
			return;
		}
	}
	while (len >= 128) {
		/* Process as many complete blocks as we can */
		SHA512_Internal_Transform(context, (const sha_word64*)data);
		ADDINC128(context->s512.bitcount, 1024);
		len -= 128;
		data += 128;
	}
	if (len > 0) {
		/* There's left-overs, so save 'em */
		MEMCPY_BCOPY(context->s512.buffer, data, len);
		ADDINC128(context->s512.bitcount, len << 3);
	}
	/* Clean up: */
	usedspace = freespace = 0;
}